

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stbi_DDS_aug_c.h
# Opt level: O3

stbi_uc * stbi_dds_load(char *filename,int *x,int *y,int *comp,int req_comp)

{
  FILE *__stream;
  stbi_uc *psVar1;
  stbi local_50;
  
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    psVar1 = (stbi_uc *)0x0;
  }
  else {
    local_50.img_file = (FILE *)__stream;
    psVar1 = dds_load(&local_50,x,y,comp,req_comp);
    fclose(__stream);
  }
  return psVar1;
}

Assistant:

stbi_uc *stbi_dds_load             (char *filename,           int *x, int *y, int *comp, int req_comp)
{
   stbi_uc *data;
   FILE *f = fopen(filename, "rb");
   if (!f) return NULL;
   data = stbi_dds_load_from_file(f,x,y,comp,req_comp);
   fclose(f);
   return data;
}